

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,Header *hd)

{
  int iVar1;
  fmtflags __fmtfl;
  Format FVar2;
  streamsize sVar3;
  ostream *poVar4;
  Long LVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  int *in_RSI;
  ostream *in_RDI;
  bool bVar9;
  RealDescriptor *in_stack_00000028;
  ostream *in_stack_00000030;
  int i_1;
  int i;
  int oldPrec;
  fmtflags oflags;
  ostream *in_stack_000000f0;
  BoxArray *in_stack_000000f8;
  ostream *in_stack_ffffffffffffff58;
  Vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  ostream *in_stack_ffffffffffffff78;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff80;
  ostream *in_stack_ffffffffffffff88;
  int local_58;
  int local_54;
  
  __fmtfl = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  std::ios_base::setf((ios_base *)in_stack_ffffffffffffff70,
                      (fmtflags)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (fmtflags)in_stack_ffffffffffffff68);
  sVar3 = std::ios_base::precision((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),0x10);
  poVar4 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
  std::operator<<(poVar4,'\n');
  poVar4 = (ostream *)std::ostream::operator<<(in_RDI,in_RSI[1]);
  std::operator<<(poVar4,'\n');
  poVar4 = (ostream *)std::ostream::operator<<(in_RDI,in_RSI[2]);
  std::operator<<(poVar4,'\n');
  iVar1 = in_RSI[3];
  bVar9 = false;
  if ((in_RSI[3] == iVar1) && (bVar9 = false, in_RSI[4] == iVar1)) {
    bVar9 = in_RSI[5] == iVar1;
  }
  if (bVar9) {
    poVar4 = (ostream *)std::ostream::operator<<(in_RDI,in_RSI[3]);
    std::operator<<(poVar4,'\n');
  }
  else {
    poVar4 = operator<<(in_stack_ffffffffffffff58,(IntVect *)0x1219c42);
    std::operator<<(poVar4,'\n');
  }
  BoxArray::writeOn(in_stack_000000f8,in_stack_000000f0);
  std::operator<<(in_RDI,'\n');
  poVar4 = operator<<(in_stack_ffffffffffffff78,
                      (Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)
                      in_stack_ffffffffffffff70);
  std::operator<<(poVar4,'\n');
  if ((*in_RSI == 1) || (*in_RSI == 3)) {
    poVar4 = operator<<(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator<<(poVar4,'\n');
    poVar4 = operator<<(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator<<(poVar4,'\n');
  }
  if (*in_RSI == 4) {
    for (local_54 = 0;
        LVar5 = Vector<double,_std::allocator<double>_>::size
                          ((Vector<double,_std::allocator<double>_> *)0x1219d1f), local_54 < LVar5;
        local_54 = local_54 + 1) {
      poVar4 = in_RDI;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
      std::operator<<(poVar4,',');
    }
    std::operator<<(in_RDI,'\n');
    local_58 = 0;
    while( true ) {
      lVar7 = (long)local_58;
      LVar5 = Vector<double,_std::allocator<double>_>::size
                        ((Vector<double,_std::allocator<double>_> *)0x1219da6);
      if (LVar5 <= lVar7) break;
      poVar4 = in_RDI;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar6);
      std::operator<<(poVar4,',');
      local_58 = local_58 + 1;
    }
    std::operator<<(in_RDI,'\n');
  }
  if (((*in_RSI == 2) || (*in_RSI == 3)) || (*in_RSI == 4)) {
    FVar2 = FArrayBox::getFormat();
    if (FVar2 == FAB_NATIVE) {
      in_stack_ffffffffffffff70 = in_RDI;
      FPC::NativeRealDescriptor();
      poVar4 = operator<<(in_stack_00000030,in_stack_00000028);
      std::operator<<(poVar4,'\n');
    }
    else {
      FVar2 = FArrayBox::getFormat();
      if (FVar2 == FAB_NATIVE_32) {
        FPC::Native32RealDescriptor();
        poVar4 = operator<<(in_stack_00000030,in_stack_00000028);
        std::operator<<(poVar4,'\n');
      }
      else {
        FVar2 = FArrayBox::getFormat();
        if (FVar2 == FAB_IEEE_32) {
          FPC::Ieee32NormalRealDescriptor();
          poVar4 = operator<<(in_stack_00000030,in_stack_00000028);
          std::operator<<(poVar4,'\n');
        }
      }
    }
  }
  std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  std::ios_base::precision
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),(long)(int)sVar3);
  uVar8 = std::ios::good();
  if ((uVar8 & 1) == 0) {
    Error_host((char *)in_stack_ffffffffffffff70);
  }
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream        &os,
            const VisMF::Header &hd)
{
    //
    // Up the precision for the Reals in m_min and m_max.
    // Force it to be written in scientific notation to match fParallel code.
    //
    std::ios::fmtflags oflags = os.flags();
    os.setf(std::ios::floatfield, std::ios::scientific);
    int oldPrec(os.precision(16));

    os << hd.m_vers     << '\n';
    os << int(hd.m_how) << '\n';
    os << hd.m_ncomp    << '\n';
    if (hd.m_ngrow == hd.m_ngrow[0]) {
        os << hd.m_ngrow[0] << '\n';
    } else {
        os << hd.m_ngrow    << '\n';
    }

    hd.m_ba.writeOn(os); os << '\n';

    os << hd.m_fod      << '\n';

    if(hd.m_vers == VisMF::Header::Version_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1)
    {
      os << hd.m_min      << '\n';
      os << hd.m_max      << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1) {
      BL_ASSERT(hd.m_famin.size() == hd.m_ncomp);
      BL_ASSERT(hd.m_famin.size() == hd.m_famax.size());
      for(int i(0); i < hd.m_famin.size(); ++i) {
        os << hd.m_famin[i] << ',';
      }
      os << '\n';
      for(int i(0); i < hd.m_famax.size(); ++i) {
        os << hd.m_famax[i] << ',';
      }
      os << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeader_v1       ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1)
    {
      if(FArrayBox::getFormat() == FABio::FAB_NATIVE) {
        os << FPC::NativeRealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_NATIVE_32) {
        os << FPC::Native32RealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_IEEE_32) {
        os << FPC::Ieee32NormalRealDescriptor() << '\n';
      }
    }

    os.flags(oflags);
    os.precision(oldPrec);

    if( ! os.good()) {
        amrex::Error("Write of VisMF::Header failed");
    }

    return os;
}